

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

void __thiscall ot::commissioner::coap::Coap::Retransmit(Coap *this,Timer *param_1)

{
  char *pcVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar5;
  bool bVar6;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  Error error;
  string uri_1;
  writer write_1;
  writer write_3;
  writer write;
  RequestHolder requestHolder;
  undefined1 local_230 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  size_t sStack_1f0;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_1e8;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *pfStack_1e0;
  code *local_1d8;
  code *pcStack_1d0;
  code *local_1c8;
  undefined1 local_1b8 [32];
  RequestsCache *local_198;
  undefined1 local_190 [16];
  size_t sStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  _Any_data local_f8;
  Coap *local_e8;
  code *local_e0;
  uint local_d8;
  Duration local_d0;
  TimePoint local_c8;
  bool local_c0;
  anon_union_8_4_85009615_for_evcb_cb_union local_b0;
  undefined1 local_a8 [8];
  anon_union_16_2_9ce1ef8e_for_ev_timeout_pos local_a0 [2];
  undefined1 local_80 [24];
  event *local_68 [2];
  Error local_58;
  
  local_190._0_8_ = std::chrono::_V2::system_clock::now();
  local_208._0_8_ = (Coap *)local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"coap","");
  local_108._0_4_ = 0xe;
  pcVar5 = "client(={}) retransmit timer triggered";
  local_108._8_8_ = "client(={}) retransmit timer triggered";
  local_f8._M_unused._M_member_pointer = 0x26;
  local_f8._8_8_ = (_Base_ptr)0x100000000;
  local_e0 = ::fmt::v10::detail::
             parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
  local_128._0_8_ = (Coap *)local_108;
  local_e8 = (Coap *)local_108;
  do {
    if (pcVar5 == "") break;
    pcVar2 = pcVar5;
    if (*pcVar5 == '{') {
LAB_00150895:
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*>_>::
      writer::operator()((writer *)local_128,pcVar5,pcVar2);
      pcVar5 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*>&>
                         (pcVar2,"",(format_string_checker<char> *)local_108);
      bVar6 = true;
    }
    else {
      pcVar2 = pcVar5 + 1;
      bVar6 = pcVar2 != "";
      if (bVar6) {
        if (*pcVar2 != '{') {
          pcVar1 = pcVar5 + 2;
          do {
            pcVar2 = pcVar1;
            bVar6 = pcVar2 != "";
            if (pcVar2 == "") goto LAB_00150891;
            pcVar1 = pcVar2 + 1;
          } while (*pcVar2 != '{');
        }
        bVar6 = true;
      }
LAB_00150891:
      if (bVar6) goto LAB_00150895;
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*>_>::
      writer::operator()((writer *)local_128,pcVar5,"");
      bVar6 = false;
    }
  } while (bVar6);
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_108;
  fmt.size_ = 0xe;
  fmt.data_ = (char *)0x26;
  local_108._0_8_ = this;
  ::fmt::v10::vformat_abi_cxx11_
            ((string *)local_230,(v10 *)"client(={}) retransmit timer triggered",fmt,args);
  Log(kDebug,(string *)local_208,(string *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_230 + 0x10)) {
    operator_delete((void *)local_230._0_8_);
  }
  if ((Coap *)local_208._0_8_ != (Coap *)local_1f8) {
    operator_delete((void *)local_208._0_8_);
  }
  local_198 = &this->mRequestsCache;
  if ((this->mRequestsCache).mContainer._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_b0.evcb_callback = (_func_void_int_short_void_ptr *)&(this->mRequestsCache).mContainer;
    do {
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_230 + 0x10);
      if ((long)local_190._0_8_ <=
          *(long *)((this->mRequestsCache).mContainer._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left + 3)) break;
      RequestsCache::Eliminate((RequestHolder *)local_108,local_198);
      local_128._0_8_ = local_128 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"UNKOWN_URI","");
      Message::GetOption((Error *)local_208,(Message *)local_108._0_8_,(string *)local_128,kUriPath)
      ;
      if ((size_t *)local_208._8_8_ != &sStack_1f0) {
        operator_delete((void *)local_208._8_8_);
      }
      if (local_d8 < 4 && ((ulong)*(_func_int ***)local_108._0_8_ & 0xc) == 0) {
        local_d8 = local_d8 + 1;
        local_c8.__d.__r = (duration)(local_190._0_8_ + local_d0.__r * 0x3d09 * 0x80);
        local_d0.__r = (rep)(local_d0.__r * 2);
        std::
        _Rb_tree<ot::commissioner::coap::Coap::RequestHolder,ot::commissioner::coap::Coap::RequestHolder,std::_Identity<ot::commissioner::coap::Coap::RequestHolder>,std::less<ot::commissioner::coap::Coap::RequestHolder>,std::allocator<ot::commissioner::coap::Coap::RequestHolder>>
        ::_M_emplace_equal<ot::commissioner::coap::Coap::RequestHolder_const&>
                  ((_Rb_tree<ot::commissioner::coap::Coap::RequestHolder,ot::commissioner::coap::Coap::RequestHolder,std::_Identity<ot::commissioner::coap::Coap::RequestHolder>,std::less<ot::commissioner::coap::Coap::RequestHolder>,std::allocator<ot::commissioner::coap::Coap::RequestHolder>>
                    *)local_b0.evcb_callback,(RequestHolder *)local_108);
        RequestsCache::UpdateTimer(local_198);
        local_190._8_8_ = &local_178;
        sStack_180 = 0;
        local_178._M_local_buf[0] = '\0';
        Message::GetOption(&local_58,(Message *)local_108._0_8_,(string *)(local_190 + 8),kUriPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.mMessage._M_dataplus._M_p != &local_58.mMessage.field_2) {
          operator_delete(local_58.mMessage._M_dataplus._M_p);
        }
        local_230._0_8_ = paVar3;
        if (local_c0 == false) {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"coap","");
          local_208._0_4_ = pointer_type;
          local_208._4_4_ = string_type;
          local_208._8_4_ = 2;
          pcVar5 = "client(={}) retransmit request {}, retransmit count = {}";
          local_1f8 = (undefined1  [8])0x216e94;
          sStack_1f0 = 0x38;
          local_1e8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)0x300000000;
          local_1c8 = ::fmt::v10::detail::
                      parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_1d8 = ::fmt::v10::detail::
                      parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
          pcStack_1d0 = ::fmt::v10::detail::
                        parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pfStack_1e0 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)local_208;
          local_168._0_8_ =
               (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_208;
          do {
            if (pcVar5 == "") break;
            pcVar2 = pcVar5;
            if (*pcVar5 == '{') {
LAB_00150ec3:
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
              ::writer::operator()((writer *)local_168,pcVar5,pcVar2);
              pcVar5 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string,unsigned_int>&>
                                 (pcVar2,"",
                                  (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                                   *)local_208);
              bVar6 = true;
            }
            else {
              pcVar2 = pcVar5 + 1;
              bVar6 = pcVar2 != "";
              if (bVar6) {
                if (*pcVar2 != '{') {
                  pcVar1 = pcVar5 + 2;
                  do {
                    pcVar2 = pcVar1;
                    bVar6 = pcVar2 != "";
                    if (pcVar2 == "") goto LAB_00150ebf;
                    pcVar1 = pcVar2 + 1;
                  } while (*pcVar2 != '{');
                }
                bVar6 = true;
              }
LAB_00150ebf:
              if (bVar6) goto LAB_00150ec3;
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
              ::writer::operator()((writer *)local_168,pcVar5,"");
              bVar6 = false;
            }
          } while (bVar6);
          local_1e8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)(ulong)local_d8;
          local_1f8 = (undefined1  [8])local_190._8_8_;
          sStack_1f0 = sStack_180;
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)local_208;
          fmt_02.size_ = 0x2de;
          fmt_02.data_ = (char *)0x38;
          local_208._0_8_ = this;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_1b8,
                     (v10 *)"client(={}) retransmit request {}, retransmit count = {}",fmt_02,
                     args_02);
          Log(kInfo,(string *)local_230,(string *)local_1b8);
          if ((event_callback *)local_1b8._0_8_ != (event_callback *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_230 + 0x10)) {
            operator_delete((void *)local_230._0_8_);
          }
          Send((Error *)local_230,this,(Message *)local_108._0_8_);
          if (local_230._0_4_ != kNone) {
            local_1b8._0_8_ = local_1b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"coap","");
            local_208._0_4_ = pointer_type;
            local_208._4_4_ = string_type;
            local_208._8_4_ = 0xd;
            pcVar5 = "client(={}) retransmit request {} failed: {}";
            local_1f8 = (undefined1  [8])0x216ecd;
            sStack_1f0 = 0x2c;
            local_1e8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)0x300000000;
            local_1c8 = ::fmt::v10::detail::
                        parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_1d8 = ::fmt::v10::detail::
                        parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
            pcStack_1d0 = ::fmt::v10::detail::
                          parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pfStack_1e0 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                           *)local_208;
            local_148._0_8_ =
                 (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)local_208;
            do {
              if (pcVar5 == "") break;
              pcVar2 = pcVar5;
              if (*pcVar5 == '{') {
LAB_0015108c:
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)local_148,pcVar5,pcVar2);
                pcVar5 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string,std::__cxx11::string>&>
                                   (pcVar2,"",
                                    (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                                     *)local_208);
                bVar6 = true;
              }
              else {
                pcVar2 = pcVar5 + 1;
                bVar6 = pcVar2 != "";
                if (bVar6) {
                  if (*pcVar2 != '{') {
                    pcVar1 = pcVar5 + 2;
                    do {
                      pcVar2 = pcVar1;
                      bVar6 = pcVar2 != "";
                      if (pcVar2 == "") goto LAB_00151088;
                      pcVar1 = pcVar2 + 1;
                    } while (*pcVar2 != '{');
                  }
                  bVar6 = true;
                }
LAB_00151088:
                if (bVar6) goto LAB_0015108c;
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)local_148,pcVar5,"");
                bVar6 = false;
              }
            } while (bVar6);
            Error::ToString_abi_cxx11_((string *)local_148,(Error *)local_230);
            local_1f8 = (undefined1  [8])local_190._8_8_;
            sStack_1f0 = sStack_180;
            local_1e8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)local_148._0_8_;
            pfStack_1e0 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                           *)local_148._8_8_;
            args_03.field_1.args_ = in_R9.args_;
            args_03.desc_ = (unsigned_long_long)local_208;
            fmt_03.size_ = 0xdde;
            fmt_03.data_ = (char *)0x2c;
            local_208._0_8_ = this;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_168,(v10 *)"client(={}) retransmit request {} failed: {}",
                       fmt_03,args_03);
            Log(kWarn,(string *)local_1b8,(string *)local_168);
            if ((format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)local_168._0_8_ !=
                (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)(local_168 + 0x10)) {
              operator_delete((void *)local_168._0_8_);
            }
            if ((format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)local_148._0_8_ !=
                (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_);
            }
            if ((event_callback *)local_1b8._0_8_ != (event_callback *)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_);
            }
            local_80._0_4_ = local_230._0_4_;
            local_80._8_8_ = local_68;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_80 + 8),local_230._8_8_,
                       (char *)(local_230._8_8_ + local_230._16_8_));
            FinalizeTransaction(this,(RequestHolder *)local_108,(Response *)0x0,(Error *)local_80);
            if ((event **)local_80._8_8_ != local_68) {
              operator_delete((void *)local_80._8_8_);
            }
          }
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_230._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._8_8_ != &local_218) goto LAB_00150c54;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"coap","");
          local_208._0_4_ = pointer_type;
          local_208._4_4_ = string_type;
          pcVar5 = "client(={}) request to {} has been acknowledged, won\'t retransmit";
          local_208._8_8_ = "client(={}) request to {} has been acknowledged, won\'t retransmit";
          local_1f8 = (undefined1  [8])0x41;
          sStack_1f0 = 0x200000000;
          pfStack_1e0 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)::fmt::v10::detail::
                           parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
          local_1d8 = ::fmt::v10::detail::
                      parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_1e8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)local_208;
          local_168._0_8_ =
               (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_208;
          do {
            if (pcVar5 == "") break;
            pcVar2 = pcVar5;
            if (*pcVar5 == '{') {
LAB_00150ba6:
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)local_168,pcVar5,pcVar2);
              pcVar5 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string>&>
                                 (pcVar2,"",
                                  (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_208);
              bVar6 = true;
            }
            else {
              pcVar2 = pcVar5 + 1;
              bVar6 = pcVar2 != "";
              if (bVar6) {
                if (*pcVar2 != '{') {
                  pcVar1 = pcVar5 + 2;
                  do {
                    pcVar2 = pcVar1;
                    bVar6 = pcVar2 != "";
                    if (pcVar2 == "") goto LAB_00150ba2;
                    pcVar1 = pcVar2 + 1;
                  } while (*pcVar2 != '{');
                }
                bVar6 = true;
              }
LAB_00150ba2:
              if (bVar6) goto LAB_00150ba6;
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)local_168,pcVar5,"");
              bVar6 = false;
            }
          } while (bVar6);
          local_1f8 = (undefined1  [8])local_190._8_8_;
          sStack_1f0 = sStack_180;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)local_208;
          fmt_00.size_ = 0xde;
          fmt_00.data_ = (char *)0x41;
          local_208._0_8_ = this;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_1b8,
                     (v10 *)"client(={}) request to {} has been acknowledged, won\'t retransmit",
                     fmt_00,args_00);
          Log(kDebug,(string *)local_230,(string *)local_1b8);
          if ((event_callback *)local_1b8._0_8_ != (event_callback *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_);
          }
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_230._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_230 + 0x10)) {
LAB_00150c54:
            operator_delete(paVar3);
          }
        }
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_190._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._8_8_ != &local_178) {
LAB_00150d92:
          operator_delete(paVar4);
        }
      }
      else {
        local_208._0_4_ = string_type;
        local_208._8_8_ = "request to {} timeout";
        local_1f8 = (undefined1  [8])0x15;
        sStack_1f0 = 0x100000000;
        pfStack_1e0 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar5 = "request to {} timeout";
        local_1e8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                     *)local_208;
        do {
          pcVar2 = pcVar5 + 1;
          if (*pcVar5 == '}') {
            if ((pcVar2 == "") || (*pcVar2 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar2 = pcVar5 + 2;
          }
          else if (*pcVar5 == '{') {
            pcVar2 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar5,"",
                                (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_208);
          }
          pcVar5 = pcVar2;
        } while (pcVar2 != "");
        local_208._0_8_ = local_128._0_8_;
        local_208._8_8_ = local_128._8_8_;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)local_208;
        fmt_01.size_ = 0xd;
        fmt_01.data_ = (char *)0x15;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_230,(v10 *)"request to {} timeout",fmt_01,args_01);
        local_a8._0_4_ = 4;
        local_a0[0]._0_8_ = local_a8 + 0x18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_a8 + 8),local_230._0_8_,
                   (char *)(local_230._8_8_ + local_230._0_8_));
        FinalizeTransaction(this,(RequestHolder *)local_108,(Response *)0x0,(Error *)local_a8);
        if ((event *)local_a0[0]._0_8_ != (event *)(local_a8 + 0x18)) {
          operator_delete((void *)local_a0[0]._0_8_);
        }
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_230._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._0_8_ != paVar3) goto LAB_00150d92;
      }
      if ((Coap *)local_128._0_8_ != (Coap *)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_);
      }
      if (local_e8 != (Coap *)0x0) {
        (*(code *)local_e8)(&local_f8,&local_f8,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
      }
    } while ((this->mRequestsCache).mContainer._M_t._M_impl.super__Rb_tree_header._M_node_count != 0
            );
  }
  RequestsCache::UpdateTimer(local_198);
  return;
}

Assistant:

void Coap::Retransmit(Timer &)
{
    auto now = Clock::now();

    LOG_DEBUG(LOG_REGION_COAP, "client(={}) retransmit timer triggered", static_cast<void *>(this));

    while (!mRequestsCache.IsEmpty() && mRequestsCache.Earliest() < now)
    {
        auto requestHolder = mRequestsCache.Eliminate();

        std::string uri = "UNKOWN_URI";
        requestHolder.mRequest->GetUriPath(uri).IgnoreError();

        if ((requestHolder.mRequest->IsConfirmable()) && (requestHolder.mRetransmissionCount < kMaxRetransmit))
        {
            // Increment retransmission counter and timer.
            ++requestHolder.mRetransmissionCount;
            requestHolder.mRetransmissionDelay *= 2;
            requestHolder.mNextTimerShot = now + requestHolder.mRetransmissionDelay;

            mRequestsCache.Put(requestHolder);

            std::string uri;
            IgnoreError(requestHolder.mRequest->GetUriPath(uri));

            // Retransmit
            if (!requestHolder.mAcknowledged)
            {
                LOG_INFO(LOG_REGION_COAP, "client(={}) retransmit request {}, retransmit count = {}",
                         static_cast<void *>(this), uri, requestHolder.mRetransmissionCount);

                auto error = Send(*requestHolder.mRequest);
                if (error != ErrorCode::kNone)
                {
                    LOG_WARN(LOG_REGION_COAP, "client(={}) retransmit request {} failed: {}", static_cast<void *>(this),
                             uri, error.ToString());
                    FinalizeTransaction(requestHolder, nullptr, error);
                }
            }
            else
            {
                LOG_DEBUG(LOG_REGION_COAP, "client(={}) request to {} has been acknowledged, won't retransmit",
                          static_cast<void *>(this), uri);
            }
        }
        else
        {
            // No expected response or acknowledgment.
            FinalizeTransaction(requestHolder, nullptr, ERROR_TIMEOUT("request to {} timeout", uri));
        }
    }

    mRequestsCache.UpdateTimer();
}